

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_ssse3.c
# Opt level: O0

void av1_build_compound_diffwtd_mask_highbd_ssse3
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,uint8_t *src0,int src0_stride,
               uint8_t *src1,int src1_stride,int h,int w,int bd)

{
  short sVar1;
  short sVar7;
  undefined8 *puVar9;
  undefined1 (*pauVar10) [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined6 uVar16;
  undefined4 uVar17;
  undefined6 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  long lVar22;
  int in_ECX;
  long in_RDX;
  char in_SIL;
  long in_RDI;
  long in_R8;
  int in_R9D;
  ushort uVar23;
  short sVar24;
  ushort uVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  short sVar29;
  undefined1 auVar27 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  __m128i m_3;
  __m128i diff_3;
  __m128i s1_3;
  __m128i s0_3;
  int j_3;
  int i_3;
  __m128i m_2;
  __m128i diff_2;
  __m128i s1_2;
  __m128i s0_2;
  int j_2;
  int i_2;
  __m128i xshift;
  __m128i m_1;
  __m128i diff_1;
  __m128i s1_1;
  __m128i s0_1;
  int j_1;
  int i_1;
  __m128i m;
  __m128i diff;
  __m128i s1;
  __m128i s0;
  int j;
  int i;
  uint16_t *ssrc1;
  uint16_t *ssrc0;
  __m128i xmask_base;
  int mask_base;
  __m128i xAOM_BLEND_A64_MAX_ALPHA;
  __m128i x0;
  byte bStackY_686;
  undefined1 uStackY_685;
  undefined1 in_stack_fffffffffffff97c;
  byte bVar30;
  undefined1 in_stack_fffffffffffff97d;
  undefined1 in_stack_fffffffffffff97e;
  byte bVar31;
  undefined1 in_stack_fffffffffffff97f;
  undefined1 in_stack_fffffffffffff980;
  undefined1 in_stack_fffffffffffff981;
  undefined1 in_stack_fffffffffffff982;
  byte bVar32;
  undefined1 in_stack_fffffffffffff983;
  undefined1 in_stack_fffffffffffff984;
  byte bVar33;
  undefined1 in_stack_fffffffffffff985;
  undefined1 in_stack_fffffffffffff986;
  byte bVar34;
  undefined1 in_stack_fffffffffffff987;
  undefined1 in_stack_fffffffffffff988 [16];
  undefined8 in_stack_fffffffffffff998;
  uint8_t *in_stack_fffffffffffff9a0;
  int local_640;
  int local_63c;
  byte bStack_636;
  undefined1 uStack_635;
  byte bStack_634;
  undefined1 uStack_633;
  byte bStack_632;
  undefined1 uStack_631;
  byte bStack_62e;
  undefined1 uStack_62d;
  byte bStack_62c;
  undefined1 uStack_62b;
  byte bStack_62a;
  undefined1 uStack_629;
  int local_5f0;
  int local_5ec;
  byte bStack_5d6;
  undefined1 uStack_5d5;
  byte bStack_5d4;
  undefined1 uStack_5d3;
  byte bStack_5d2;
  undefined1 uStack_5d1;
  byte bStack_5ce;
  undefined1 uStack_5cd;
  byte bStack_5cc;
  undefined1 uStack_5cb;
  byte bStack_5ca;
  undefined1 uStack_5c9;
  int local_590;
  int local_58c;
  byte bStack_586;
  undefined1 uStack_585;
  byte bStack_584;
  undefined1 uStack_583;
  byte bStack_582;
  undefined1 uStack_581;
  byte bStack_57e;
  undefined1 uStack_57d;
  byte bStack_57c;
  undefined1 uStack_57b;
  byte bStack_57a;
  undefined1 uStack_579;
  int in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffac0;
  int iVar35;
  int local_53c;
  long local_538;
  long local_530;
  long local_4c0;
  short local_3d8;
  short sStack_3d6;
  short sStack_3d4;
  short sStack_3d2;
  short sStack_3d0;
  short sStack_3ce;
  short sStack_3cc;
  short sStack_3ca;
  short sStack_3c6;
  short sStack_3c4;
  short sStack_3c2;
  short sStack_3be;
  short sStack_3bc;
  short sStack_3ba;
  short local_398;
  short sStack_396;
  short sStack_394;
  short sStack_392;
  short sStack_390;
  short sStack_38e;
  short sStack_38c;
  short sStack_38a;
  short local_388;
  short sStack_386;
  short sStack_384;
  short sStack_382;
  short sStack_380;
  short sStack_37e;
  short sStack_37c;
  short sStack_37a;
  short local_378;
  short sStack_376;
  short sStack_374;
  short sStack_372;
  short sStack_370;
  short sStack_36e;
  short sStack_36c;
  short sStack_36a;
  short sStack_366;
  short sStack_364;
  short sStack_362;
  short sStack_35e;
  short sStack_35c;
  short sStack_35a;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_338;
  short sStack_336;
  short sStack_334;
  short sStack_332;
  short sStack_330;
  short sStack_32e;
  short sStack_32c;
  short sStack_32a;
  short local_218;
  short sStack_216;
  short sStack_214;
  short sStack_212;
  short sStack_210;
  short sStack_20e;
  short sStack_20c;
  short sStack_20a;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar8;
  
  if (in_stack_00000010 < 8) {
    av1_build_compound_diffwtd_mask_highbd_c
              (in_stack_fffffffffffff9a0,
               (DIFFWTD_MASK_TYPE)((ulong)in_stack_fffffffffffff998 >> 0x38),
               in_stack_fffffffffffff988._8_8_,in_stack_fffffffffffff988._4_4_,
               (uint8_t *)
               CONCAT17(in_stack_fffffffffffff987,
                        CONCAT16(in_stack_fffffffffffff986,
                                 CONCAT15(in_stack_fffffffffffff985,
                                          CONCAT14(in_stack_fffffffffffff984,
                                                   CONCAT13(in_stack_fffffffffffff983,
                                                            CONCAT12(in_stack_fffffffffffff982,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffff981,
                                                  in_stack_fffffffffffff980))))))),
               CONCAT13(in_stack_fffffffffffff97f,
                        CONCAT12(in_stack_fffffffffffff97e,
                                 CONCAT11(in_stack_fffffffffffff97d,in_stack_fffffffffffff97c))),
               in_stack_fffffffffffffab0,in_stack_fffffffffffffab8,in_stack_fffffffffffffac0);
  }
  else {
    local_530 = in_RDX << 1;
    local_538 = in_R8 << 1;
    local_4c0 = in_RDI;
    if (in_stack_00000018 == 8) {
      if (in_SIL == '\x01') {
        for (local_53c = 0; local_53c < in_stack_00000008; local_53c = local_53c + 1) {
          for (iVar35 = 0; iVar35 < in_stack_00000010; iVar35 = iVar35 + 8) {
            puVar9 = (undefined8 *)(local_530 + (long)iVar35 * 2);
            uVar11 = *puVar9;
            uVar12 = puVar9[1];
            puVar9 = (undefined8 *)(local_538 + (long)iVar35 * 2);
            uVar13 = *puVar9;
            uVar14 = puVar9[1];
            local_338 = (short)uVar11;
            sStack_336 = (short)((ulong)uVar11 >> 0x10);
            sStack_334 = (short)((ulong)uVar11 >> 0x20);
            sStack_332 = (short)((ulong)uVar11 >> 0x30);
            sStack_330 = (short)uVar12;
            sStack_32e = (short)((ulong)uVar12 >> 0x10);
            sStack_32c = (short)((ulong)uVar12 >> 0x20);
            sStack_32a = (short)((ulong)uVar12 >> 0x30);
            local_348 = (short)uVar13;
            sStack_346 = (short)((ulong)uVar13 >> 0x10);
            sStack_344 = (short)((ulong)uVar13 >> 0x20);
            sStack_342 = (short)((ulong)uVar13 >> 0x30);
            sStack_340 = (short)uVar14;
            sStack_33e = (short)((ulong)uVar14 >> 0x10);
            sStack_33c = (short)((ulong)uVar14 >> 0x20);
            sStack_33a = (short)((ulong)uVar14 >> 0x30);
            auVar25._0_2_ = local_338 - local_348;
            auVar25._2_2_ = sStack_336 - sStack_346;
            auVar25._4_2_ = sStack_334 - sStack_344;
            auVar25._6_2_ = sStack_332 - sStack_342;
            auVar25._8_2_ = sStack_330 - sStack_340;
            auVar25._10_2_ = sStack_32e - sStack_33e;
            auVar25._12_2_ = sStack_32c - sStack_33c;
            auVar25._14_2_ = sStack_32a - sStack_33a;
            auVar26 = pabsw(auVar25,auVar25);
            auVar26 = psraw(auVar26,ZEXT416(4));
            local_1b8 = auVar26._0_2_;
            sStack_1b6 = auVar26._2_2_;
            sStack_1b4 = auVar26._4_2_;
            sStack_1b2 = auVar26._6_2_;
            sStack_1b0 = auVar26._8_2_;
            sStack_1ae = auVar26._10_2_;
            sStack_1ac = auVar26._12_2_;
            sStack_1aa = auVar26._14_2_;
            sVar1 = (ushort)(0 < (short)(local_1b8 + 0x26)) * (local_1b8 + 0x26);
            sVar24 = (ushort)(0 < (short)(sStack_1b6 + 0x26)) * (sStack_1b6 + 0x26);
            sVar29 = (ushort)(0 < (short)(sStack_1b4 + 0x26)) * (sStack_1b4 + 0x26);
            sVar2 = (ushort)(0 < (short)(sStack_1b2 + 0x26)) * (sStack_1b2 + 0x26);
            sVar3 = (ushort)(0 < (short)(sStack_1b0 + 0x26)) * (sStack_1b0 + 0x26);
            sVar4 = (ushort)(0 < (short)(sStack_1ae + 0x26)) * (sStack_1ae + 0x26);
            sVar5 = (ushort)(0 < (short)(sStack_1ac + 0x26)) * (sStack_1ac + 0x26);
            sVar6 = (ushort)(0 < (short)(sStack_1aa + 0x26)) * (sStack_1aa + 0x26);
            uVar23 = (ushort)(0x40 < sVar1) * 0x40 | (ushort)(0x40 >= sVar1) * sVar1;
            sVar7 = (ushort)(0x40 >= sVar24) * sVar24;
            bStack_586 = (0x40 < sVar24) * '@' | (byte)sVar7;
            sVar8 = (ushort)(0x40 >= sVar29) * sVar29;
            bStack_584 = (0x40 < sVar29) * '@' | (byte)sVar8;
            sVar24 = (ushort)(0x40 >= sVar2) * sVar2;
            bStack_582 = (0x40 < sVar2) * '@' | (byte)sVar24;
            uVar28 = (ushort)(0x40 < sVar3) * 0x40 | (ushort)(0x40 >= sVar3) * sVar3;
            sVar29 = (ushort)(0x40 >= sVar4) * sVar4;
            bStack_57e = (0x40 < sVar4) * '@' | (byte)sVar29;
            sVar1 = (ushort)(0x40 >= sVar5) * sVar5;
            bStack_57c = (0x40 < sVar5) * '@' | (byte)sVar1;
            sVar5 = (ushort)(0x40 >= sVar6) * sVar6;
            bStack_57a = (0x40 < sVar6) * '@' | (byte)sVar5;
            uStack_585 = (undefined1)((ushort)sVar7 >> 8);
            uStack_583 = (undefined1)((ushort)sVar8 >> 8);
            uStack_581 = (undefined1)((ushort)sVar24 >> 8);
            uStack_57d = (undefined1)((ushort)sVar29 >> 8);
            uStack_57b = (undefined1)((ushort)sVar1 >> 8);
            uStack_579 = (undefined1)((ushort)sVar5 >> 8);
            uVar15 = CONCAT13(uStack_585,CONCAT12(bStack_586,uVar23));
            uVar16 = CONCAT15(uStack_583,CONCAT14(bStack_584,uVar15));
            uVar17 = CONCAT13(uStack_57d,CONCAT12(bStack_57e,uVar28));
            uVar18 = CONCAT15(uStack_57b,CONCAT14(bStack_57c,uVar17));
            sStack_366 = (short)((uint)uVar15 >> 0x10);
            sStack_364 = (short)((uint6)uVar16 >> 0x20);
            sStack_362 = (short)(CONCAT17(uStack_581,CONCAT16(bStack_582,uVar16)) >> 0x30);
            sStack_35e = (short)((uint)uVar17 >> 0x10);
            sStack_35c = (short)((uint6)uVar18 >> 0x20);
            sStack_35a = (short)(CONCAT17(uStack_579,CONCAT16(bStack_57a,uVar18)) >> 0x30);
            sVar24 = 0x40 - uVar23;
            sVar29 = 0x40 - uVar28;
            bStack_586 = (byte)(0x40 - sStack_366);
            uStack_585 = (undefined1)((ushort)(0x40 - sStack_366) >> 8);
            bStack_584 = (byte)(0x40 - sStack_364);
            uStack_583 = (undefined1)((ushort)(0x40 - sStack_364) >> 8);
            bStack_582 = (byte)(0x40 - sStack_362);
            uStack_581 = (undefined1)((ushort)(0x40 - sStack_362) >> 8);
            bStack_57e = (byte)(0x40 - sStack_35e);
            uStack_57d = (undefined1)((ushort)(0x40 - sStack_35e) >> 8);
            bStack_57c = (byte)(0x40 - sStack_35c);
            uStack_57b = (undefined1)((ushort)(0x40 - sStack_35c) >> 8);
            bStack_57a = (byte)(0x40 - sStack_35a);
            uStack_579 = (undefined1)((ushort)(0x40 - sStack_35a) >> 8);
            uVar15 = CONCAT13(uStack_585,CONCAT12(bStack_586,sVar24));
            uVar16 = CONCAT15(uStack_583,CONCAT14(bStack_584,uVar15));
            uVar17 = CONCAT13(uStack_57d,CONCAT12(bStack_57e,sVar29));
            uVar18 = CONCAT15(uStack_57b,CONCAT14(bStack_57c,uVar17));
            sStack_136 = (short)((uint)uVar15 >> 0x10);
            sStack_134 = (short)((uint6)uVar16 >> 0x20);
            sStack_132 = (short)(CONCAT17(uStack_581,CONCAT16(bStack_582,uVar16)) >> 0x30);
            sStack_12e = (short)((uint)uVar17 >> 0x10);
            sStack_12c = (short)((uint6)uVar18 >> 0x20);
            sStack_12a = (short)(CONCAT17(uStack_579,CONCAT16(bStack_57a,uVar18)) >> 0x30);
            *(ulong *)(local_4c0 + iVar35) =
                 CONCAT17((0 < sStack_12a) * (sStack_12a < 0x100) * bStack_57a - (0xff < sStack_12a)
                          ,CONCAT16((0 < sStack_12c) * (sStack_12c < 0x100) * bStack_57c -
                                    (0xff < sStack_12c),
                                    CONCAT15((0 < sStack_12e) * (sStack_12e < 0x100) * bStack_57e -
                                             (0xff < sStack_12e),
                                             CONCAT14((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29
                                                      - (0xff < sVar29),
                                                      CONCAT13((0 < sStack_132) *
                                                               (sStack_132 < 0x100) * bStack_582 -
                                                               (0xff < sStack_132),
                                                               CONCAT12((0 < sStack_134) *
                                                                        (sStack_134 < 0x100) *
                                                                        bStack_584 -
                                                                        (0xff < sStack_134),
                                                                        CONCAT11((0 < sStack_136) *
                                                                                 (sStack_136 < 0x100
                                                                                 ) * bStack_586 -
                                                                                 (0xff < sStack_136)
                                                                                 ,(0 < sVar24) *
                                                                                  (sVar24 < 0x100) *
                                                                                  (char)sVar24 -
                                                                                  (0xff < sVar24))))
                                                     ))));
          }
          local_530 = local_530 + (long)in_ECX * 2;
          local_538 = local_538 + (long)in_R9D * 2;
          local_4c0 = local_4c0 + in_stack_00000010;
        }
      }
      else {
        for (local_58c = 0; local_58c < in_stack_00000008; local_58c = local_58c + 1) {
          for (local_590 = 0; local_590 < in_stack_00000010; local_590 = local_590 + 8) {
            puVar9 = (undefined8 *)(local_530 + (long)local_590 * 2);
            uVar11 = *puVar9;
            uVar12 = puVar9[1];
            puVar9 = (undefined8 *)(local_538 + (long)local_590 * 2);
            uVar13 = *puVar9;
            uVar14 = puVar9[1];
            local_378 = (short)uVar11;
            sStack_376 = (short)((ulong)uVar11 >> 0x10);
            sStack_374 = (short)((ulong)uVar11 >> 0x20);
            sStack_372 = (short)((ulong)uVar11 >> 0x30);
            sStack_370 = (short)uVar12;
            sStack_36e = (short)((ulong)uVar12 >> 0x10);
            sStack_36c = (short)((ulong)uVar12 >> 0x20);
            sStack_36a = (short)((ulong)uVar12 >> 0x30);
            local_388 = (short)uVar13;
            sStack_386 = (short)((ulong)uVar13 >> 0x10);
            sStack_384 = (short)((ulong)uVar13 >> 0x20);
            sStack_382 = (short)((ulong)uVar13 >> 0x30);
            sStack_380 = (short)uVar14;
            sStack_37e = (short)((ulong)uVar14 >> 0x10);
            sStack_37c = (short)((ulong)uVar14 >> 0x20);
            sStack_37a = (short)((ulong)uVar14 >> 0x30);
            auVar27._0_2_ = local_378 - local_388;
            auVar27._2_2_ = sStack_376 - sStack_386;
            auVar27._4_2_ = sStack_374 - sStack_384;
            auVar27._6_2_ = sStack_372 - sStack_382;
            auVar27._8_2_ = sStack_370 - sStack_380;
            auVar27._10_2_ = sStack_36e - sStack_37e;
            auVar27._12_2_ = sStack_36c - sStack_37c;
            auVar27._14_2_ = sStack_36a - sStack_37a;
            auVar26 = pabsw(auVar27,auVar27);
            auVar26 = psraw(auVar26,ZEXT416(4));
            local_1d8 = auVar26._0_2_;
            sStack_1d6 = auVar26._2_2_;
            sStack_1d4 = auVar26._4_2_;
            sStack_1d2 = auVar26._6_2_;
            sStack_1d0 = auVar26._8_2_;
            sStack_1ce = auVar26._10_2_;
            sStack_1cc = auVar26._12_2_;
            sStack_1ca = auVar26._14_2_;
            sVar6 = (ushort)(0 < (short)(local_1d8 + 0x26)) * (local_1d8 + 0x26);
            sVar1 = (ushort)(0 < (short)(sStack_1d6 + 0x26)) * (sStack_1d6 + 0x26);
            sVar29 = (ushort)(0 < (short)(sStack_1d4 + 0x26)) * (sStack_1d4 + 0x26);
            sVar24 = (ushort)(0 < (short)(sStack_1d2 + 0x26)) * (sStack_1d2 + 0x26);
            sVar5 = (ushort)(0 < (short)(sStack_1d0 + 0x26)) * (sStack_1d0 + 0x26);
            sVar4 = (ushort)(0 < (short)(sStack_1ce + 0x26)) * (sStack_1ce + 0x26);
            sVar3 = (ushort)(0 < (short)(sStack_1cc + 0x26)) * (sStack_1cc + 0x26);
            sVar2 = (ushort)(0 < (short)(sStack_1ca + 0x26)) * (sStack_1ca + 0x26);
            uVar23 = (ushort)(0x40 < sVar6) * 0x40 | (ushort)(0x40 >= sVar6) * sVar6;
            sVar6 = (ushort)(0x40 >= sVar1) * sVar1;
            bStack_5d6 = (0x40 < sVar1) * '@' | (byte)sVar6;
            sVar1 = (ushort)(0x40 >= sVar29) * sVar29;
            bStack_5d4 = (0x40 < sVar29) * '@' | (byte)sVar1;
            sVar8 = (ushort)(0x40 >= sVar24) * sVar24;
            bStack_5d2 = (0x40 < sVar24) * '@' | (byte)sVar8;
            uVar28 = (ushort)(0x40 < sVar5) * 0x40 | (ushort)(0x40 >= sVar5) * sVar5;
            sVar5 = (ushort)(0x40 >= sVar4) * sVar4;
            bStack_5ce = (0x40 < sVar4) * '@' | (byte)sVar5;
            sVar29 = (ushort)(0x40 >= sVar3) * sVar3;
            bStack_5cc = (0x40 < sVar3) * '@' | (byte)sVar29;
            sVar24 = (ushort)(0x40 >= sVar2) * sVar2;
            bStack_5ca = (0x40 < sVar2) * '@' | (byte)sVar24;
            uStack_5d5 = (undefined1)((ushort)sVar6 >> 8);
            uStack_5d3 = (undefined1)((ushort)sVar1 >> 8);
            uStack_5d1 = (undefined1)((ushort)sVar8 >> 8);
            uStack_5cd = (undefined1)((ushort)sVar5 >> 8);
            uStack_5cb = (undefined1)((ushort)sVar29 >> 8);
            uStack_5c9 = (undefined1)((ushort)sVar24 >> 8);
            uVar15 = CONCAT13(uStack_5d5,CONCAT12(bStack_5d6,uVar23));
            uVar16 = CONCAT15(uStack_5d3,CONCAT14(bStack_5d4,uVar15));
            uVar17 = CONCAT13(uStack_5cd,CONCAT12(bStack_5ce,uVar28));
            uVar18 = CONCAT15(uStack_5cb,CONCAT14(bStack_5cc,uVar17));
            sStack_156 = (short)((uint)uVar15 >> 0x10);
            sStack_154 = (short)((uint6)uVar16 >> 0x20);
            sStack_152 = (short)(CONCAT17(uStack_5d1,CONCAT16(bStack_5d2,uVar16)) >> 0x30);
            sStack_14e = (short)((uint)uVar17 >> 0x10);
            sStack_14c = (short)((uint6)uVar18 >> 0x20);
            sStack_14a = (short)(CONCAT17(uStack_5c9,CONCAT16(bStack_5ca,uVar18)) >> 0x30);
            *(ulong *)(local_4c0 + local_590) =
                 CONCAT17((0 < sStack_14a) * (sStack_14a < 0x100) * bStack_5ca - (0xff < sStack_14a)
                          ,CONCAT16((0 < sStack_14c) * (sStack_14c < 0x100) * bStack_5cc -
                                    (0xff < sStack_14c),
                                    CONCAT15((0 < sStack_14e) * (sStack_14e < 0x100) * bStack_5ce -
                                             (0xff < sStack_14e),
                                             CONCAT14((0 < (short)uVar28) * ((short)uVar28 < 0x100)
                                                      * (char)uVar28 - (0xff < (short)uVar28),
                                                      CONCAT13((0 < sStack_152) *
                                                               (sStack_152 < 0x100) * bStack_5d2 -
                                                               (0xff < sStack_152),
                                                               CONCAT12((0 < sStack_154) *
                                                                        (sStack_154 < 0x100) *
                                                                        bStack_5d4 -
                                                                        (0xff < sStack_154),
                                                                        CONCAT11((0 < sStack_156) *
                                                                                 (sStack_156 < 0x100
                                                                                 ) * bStack_5d6 -
                                                                                 (0xff < sStack_156)
                                                                                 ,(0 < (short)uVar23
                                                                                  ) * ((short)uVar23
                                                                                      < 0x100) *
                                                                                  (char)uVar23 -
                                                                                  (0xff < (short)
                                                  uVar23))))))));
          }
          local_530 = local_530 + (long)in_ECX * 2;
          local_538 = local_538 + (long)in_R9D * 2;
          local_4c0 = local_4c0 + in_stack_00000010;
        }
      }
    }
    else {
      lVar22 = (long)(in_stack_00000018 + -4);
      if (in_SIL == '\x01') {
        for (local_5ec = 0; local_5ec < in_stack_00000008; local_5ec = local_5ec + 1) {
          for (local_5f0 = 0; local_5f0 < in_stack_00000010; local_5f0 = local_5f0 + 8) {
            puVar9 = (undefined8 *)(local_530 + (long)local_5f0 * 2);
            uVar11 = *puVar9;
            uVar12 = puVar9[1];
            pauVar10 = (undefined1 (*) [16])(local_538 + (long)local_5f0 * 2);
            uVar13 = *(undefined8 *)*pauVar10;
            uVar14 = *(undefined8 *)(*pauVar10 + 8);
            local_398 = (short)uVar11;
            sStack_396 = (short)((ulong)uVar11 >> 0x10);
            sStack_394 = (short)((ulong)uVar11 >> 0x20);
            sStack_392 = (short)((ulong)uVar11 >> 0x30);
            sStack_390 = (short)uVar12;
            sStack_38e = (short)((ulong)uVar12 >> 0x10);
            sStack_38c = (short)((ulong)uVar12 >> 0x20);
            sStack_38a = (short)((ulong)uVar12 >> 0x30);
            auVar19._2_2_ = sStack_396 - (short)((ulong)uVar13 >> 0x10);
            auVar19._0_2_ = local_398 - (short)uVar13;
            auVar19._4_2_ = sStack_394 - (short)((ulong)uVar13 >> 0x20);
            auVar19._6_2_ = sStack_392 - (short)((ulong)uVar13 >> 0x30);
            auVar19._8_2_ = sStack_390 - (short)uVar14;
            auVar19._10_2_ = sStack_38e - (short)((ulong)uVar14 >> 0x10);
            auVar19._12_2_ = sStack_38c - (short)((ulong)uVar14 >> 0x20);
            auVar19._14_2_ = sStack_38a - (short)((ulong)uVar14 >> 0x30);
            auVar26 = pabsw(*pauVar10,auVar19);
            auVar21._8_8_ = lVar22;
            auVar21._0_8_ = lVar22;
            auVar26 = psraw(auVar26,auVar21);
            local_1f8 = auVar26._0_2_;
            sStack_1f6 = auVar26._2_2_;
            sStack_1f4 = auVar26._4_2_;
            sStack_1f2 = auVar26._6_2_;
            sStack_1f0 = auVar26._8_2_;
            sStack_1ee = auVar26._10_2_;
            sStack_1ec = auVar26._12_2_;
            sStack_1ea = auVar26._14_2_;
            sVar6 = (ushort)(0 < (short)(local_1f8 + 0x26)) * (local_1f8 + 0x26);
            sVar1 = (ushort)(0 < (short)(sStack_1f6 + 0x26)) * (sStack_1f6 + 0x26);
            sVar29 = (ushort)(0 < (short)(sStack_1f4 + 0x26)) * (sStack_1f4 + 0x26);
            sVar4 = (ushort)(0 < (short)(sStack_1f2 + 0x26)) * (sStack_1f2 + 0x26);
            sVar3 = (ushort)(0 < (short)(sStack_1f0 + 0x26)) * (sStack_1f0 + 0x26);
            sVar2 = (ushort)(0 < (short)(sStack_1ee + 0x26)) * (sStack_1ee + 0x26);
            sVar24 = (ushort)(0 < (short)(sStack_1ec + 0x26)) * (sStack_1ec + 0x26);
            sVar5 = (ushort)(0 < (short)(sStack_1ea + 0x26)) * (sStack_1ea + 0x26);
            uVar23 = (ushort)(0x40 < sVar6) * 0x40 | (ushort)(0x40 >= sVar6) * sVar6;
            sVar6 = (ushort)(0x40 >= sVar1) * sVar1;
            bStack_636 = (0x40 < sVar1) * '@' | (byte)sVar6;
            sVar7 = (ushort)(0x40 >= sVar29) * sVar29;
            bStack_634 = (0x40 < sVar29) * '@' | (byte)sVar7;
            sVar8 = (ushort)(0x40 >= sVar4) * sVar4;
            bStack_632 = (0x40 < sVar4) * '@' | (byte)sVar8;
            uVar28 = (ushort)(0x40 < sVar3) * 0x40 | (ushort)(0x40 >= sVar3) * sVar3;
            sVar1 = (ushort)(0x40 >= sVar2) * sVar2;
            bStack_62e = (0x40 < sVar2) * '@' | (byte)sVar1;
            sVar29 = (ushort)(0x40 >= sVar24) * sVar24;
            bStack_62c = (0x40 < sVar24) * '@' | (byte)sVar29;
            sVar24 = (ushort)(0x40 >= sVar5) * sVar5;
            bStack_62a = (0x40 < sVar5) * '@' | (byte)sVar24;
            uStack_635 = (undefined1)((ushort)sVar6 >> 8);
            uStack_633 = (undefined1)((ushort)sVar7 >> 8);
            uStack_631 = (undefined1)((ushort)sVar8 >> 8);
            uStack_62d = (undefined1)((ushort)sVar1 >> 8);
            uStack_62b = (undefined1)((ushort)sVar29 >> 8);
            uStack_629 = (undefined1)((ushort)sVar24 >> 8);
            uVar15 = CONCAT13(uStack_635,CONCAT12(bStack_636,uVar23));
            uVar16 = CONCAT15(uStack_633,CONCAT14(bStack_634,uVar15));
            uVar17 = CONCAT13(uStack_62d,CONCAT12(bStack_62e,uVar28));
            uVar18 = CONCAT15(uStack_62b,CONCAT14(bStack_62c,uVar17));
            sStack_3c6 = (short)((uint)uVar15 >> 0x10);
            sStack_3c4 = (short)((uint6)uVar16 >> 0x20);
            sStack_3c2 = (short)(CONCAT17(uStack_631,CONCAT16(bStack_632,uVar16)) >> 0x30);
            sStack_3be = (short)((uint)uVar17 >> 0x10);
            sStack_3bc = (short)((uint6)uVar18 >> 0x20);
            sStack_3ba = (short)(CONCAT17(uStack_629,CONCAT16(bStack_62a,uVar18)) >> 0x30);
            sVar24 = 0x40 - uVar23;
            sVar29 = 0x40 - uVar28;
            bStack_636 = (byte)(0x40 - sStack_3c6);
            uStack_635 = (undefined1)((ushort)(0x40 - sStack_3c6) >> 8);
            bStack_634 = (byte)(0x40 - sStack_3c4);
            uStack_633 = (undefined1)((ushort)(0x40 - sStack_3c4) >> 8);
            bStack_632 = (byte)(0x40 - sStack_3c2);
            uStack_631 = (undefined1)((ushort)(0x40 - sStack_3c2) >> 8);
            bStack_62e = (byte)(0x40 - sStack_3be);
            uStack_62d = (undefined1)((ushort)(0x40 - sStack_3be) >> 8);
            bStack_62c = (byte)(0x40 - sStack_3bc);
            uStack_62b = (undefined1)((ushort)(0x40 - sStack_3bc) >> 8);
            bStack_62a = (byte)(0x40 - sStack_3ba);
            uStack_629 = (undefined1)((ushort)(0x40 - sStack_3ba) >> 8);
            uVar15 = CONCAT13(uStack_635,CONCAT12(bStack_636,sVar24));
            uVar16 = CONCAT15(uStack_633,CONCAT14(bStack_634,uVar15));
            uVar17 = CONCAT13(uStack_62d,CONCAT12(bStack_62e,sVar29));
            uVar18 = CONCAT15(uStack_62b,CONCAT14(bStack_62c,uVar17));
            sStack_176 = (short)((uint)uVar15 >> 0x10);
            sStack_174 = (short)((uint6)uVar16 >> 0x20);
            sStack_172 = (short)(CONCAT17(uStack_631,CONCAT16(bStack_632,uVar16)) >> 0x30);
            sStack_16e = (short)((uint)uVar17 >> 0x10);
            sStack_16c = (short)((uint6)uVar18 >> 0x20);
            sStack_16a = (short)(CONCAT17(uStack_629,CONCAT16(bStack_62a,uVar18)) >> 0x30);
            *(ulong *)(local_4c0 + local_5f0) =
                 CONCAT17((0 < sStack_16a) * (sStack_16a < 0x100) * bStack_62a - (0xff < sStack_16a)
                          ,CONCAT16((0 < sStack_16c) * (sStack_16c < 0x100) * bStack_62c -
                                    (0xff < sStack_16c),
                                    CONCAT15((0 < sStack_16e) * (sStack_16e < 0x100) * bStack_62e -
                                             (0xff < sStack_16e),
                                             CONCAT14((0 < sVar29) * (sVar29 < 0x100) * (char)sVar29
                                                      - (0xff < sVar29),
                                                      CONCAT13((0 < sStack_172) *
                                                               (sStack_172 < 0x100) * bStack_632 -
                                                               (0xff < sStack_172),
                                                               CONCAT12((0 < sStack_174) *
                                                                        (sStack_174 < 0x100) *
                                                                        bStack_634 -
                                                                        (0xff < sStack_174),
                                                                        CONCAT11((0 < sStack_176) *
                                                                                 (sStack_176 < 0x100
                                                                                 ) * bStack_636 -
                                                                                 (0xff < sStack_176)
                                                                                 ,(0 < sVar24) *
                                                                                  (sVar24 < 0x100) *
                                                                                  (char)sVar24 -
                                                                                  (0xff < sVar24))))
                                                     ))));
          }
          local_530 = local_530 + (long)in_ECX * 2;
          local_538 = local_538 + (long)in_R9D * 2;
          local_4c0 = local_4c0 + in_stack_00000010;
        }
      }
      else {
        for (local_63c = 0; local_63c < in_stack_00000008; local_63c = local_63c + 1) {
          for (local_640 = 0; local_640 < in_stack_00000010; local_640 = local_640 + 8) {
            puVar9 = (undefined8 *)(local_530 + (long)local_640 * 2);
            uVar11 = *puVar9;
            uVar12 = puVar9[1];
            pauVar10 = (undefined1 (*) [16])(local_538 + (long)local_640 * 2);
            uVar13 = *(undefined8 *)*pauVar10;
            uVar14 = *(undefined8 *)(*pauVar10 + 8);
            local_3d8 = (short)uVar11;
            sStack_3d6 = (short)((ulong)uVar11 >> 0x10);
            sStack_3d4 = (short)((ulong)uVar11 >> 0x20);
            sStack_3d2 = (short)((ulong)uVar11 >> 0x30);
            sStack_3d0 = (short)uVar12;
            sStack_3ce = (short)((ulong)uVar12 >> 0x10);
            sStack_3cc = (short)((ulong)uVar12 >> 0x20);
            sStack_3ca = (short)((ulong)uVar12 >> 0x30);
            auVar26._2_2_ = sStack_3d6 - (short)((ulong)uVar13 >> 0x10);
            auVar26._0_2_ = local_3d8 - (short)uVar13;
            auVar26._4_2_ = sStack_3d4 - (short)((ulong)uVar13 >> 0x20);
            auVar26._6_2_ = sStack_3d2 - (short)((ulong)uVar13 >> 0x30);
            auVar26._8_2_ = sStack_3d0 - (short)uVar14;
            auVar26._10_2_ = sStack_3ce - (short)((ulong)uVar14 >> 0x10);
            auVar26._12_2_ = sStack_3cc - (short)((ulong)uVar14 >> 0x20);
            auVar26._14_2_ = sStack_3ca - (short)((ulong)uVar14 >> 0x30);
            auVar26 = pabsw(*pauVar10,auVar26);
            auVar20._8_8_ = lVar22;
            auVar20._0_8_ = lVar22;
            auVar26 = psraw(auVar26,auVar20);
            local_218 = auVar26._0_2_;
            sStack_216 = auVar26._2_2_;
            sStack_214 = auVar26._4_2_;
            sStack_212 = auVar26._6_2_;
            sStack_210 = auVar26._8_2_;
            sStack_20e = auVar26._10_2_;
            sStack_20c = auVar26._12_2_;
            sStack_20a = auVar26._14_2_;
            sVar1 = (ushort)(0 < (short)(local_218 + 0x26)) * (local_218 + 0x26);
            sVar29 = (ushort)(0 < (short)(sStack_216 + 0x26)) * (sStack_216 + 0x26);
            sVar24 = (ushort)(0 < (short)(sStack_214 + 0x26)) * (sStack_214 + 0x26);
            sVar6 = (ushort)(0 < (short)(sStack_212 + 0x26)) * (sStack_212 + 0x26);
            sVar5 = (ushort)(0 < (short)(sStack_210 + 0x26)) * (sStack_210 + 0x26);
            sVar4 = (ushort)(0 < (short)(sStack_20e + 0x26)) * (sStack_20e + 0x26);
            sVar3 = (ushort)(0 < (short)(sStack_20c + 0x26)) * (sStack_20c + 0x26);
            sVar2 = (ushort)(0 < (short)(sStack_20a + 0x26)) * (sStack_20a + 0x26);
            uVar23 = (ushort)(0x40 < sVar1) * 0x40 | (ushort)(0x40 >= sVar1) * sVar1;
            sVar1 = (ushort)(0x40 >= sVar29) * sVar29;
            bStackY_686 = (0x40 < sVar29) * '@' | (byte)sVar1;
            sVar29 = (ushort)(0x40 >= sVar24) * sVar24;
            bVar30 = (0x40 < sVar24) * '@' | (byte)sVar29;
            sVar8 = (ushort)(0x40 >= sVar6) * sVar6;
            bVar31 = (0x40 < sVar6) * '@' | (byte)sVar8;
            uVar28 = (ushort)(0x40 < sVar5) * 0x40 | (ushort)(0x40 >= sVar5) * sVar5;
            sVar6 = (ushort)(0x40 >= sVar4) * sVar4;
            bVar32 = (0x40 < sVar4) * '@' | (byte)sVar6;
            sVar5 = (ushort)(0x40 >= sVar3) * sVar3;
            bVar33 = (0x40 < sVar3) * '@' | (byte)sVar5;
            sVar24 = (ushort)(0x40 >= sVar2) * sVar2;
            bVar34 = (0x40 < sVar2) * '@' | (byte)sVar24;
            uStackY_685 = (undefined1)((ushort)sVar1 >> 8);
            uVar15 = CONCAT13(uStackY_685,CONCAT12(bStackY_686,uVar23));
            uVar16 = CONCAT15((char)((ushort)sVar29 >> 8),CONCAT14(bVar30,uVar15));
            uVar17 = CONCAT13((char)((ushort)sVar6 >> 8),CONCAT12(bVar32,uVar28));
            uVar18 = CONCAT15((char)((ushort)sVar5 >> 8),CONCAT14(bVar33,uVar17));
            sStack_196 = (short)((uint)uVar15 >> 0x10);
            sStack_194 = (short)((uint6)uVar16 >> 0x20);
            sStack_192 = (short)(CONCAT17((char)((ushort)sVar8 >> 8),CONCAT16(bVar31,uVar16)) >>
                                0x30);
            sStack_18e = (short)((uint)uVar17 >> 0x10);
            sStack_18c = (short)((uint6)uVar18 >> 0x20);
            sStack_18a = (short)(CONCAT17((char)((ushort)sVar24 >> 8),CONCAT16(bVar34,uVar18)) >>
                                0x30);
            *(ulong *)(local_4c0 + local_640) =
                 CONCAT17((0 < sStack_18a) * (sStack_18a < 0x100) * bVar34 - (0xff < sStack_18a),
                          CONCAT16((0 < sStack_18c) * (sStack_18c < 0x100) * bVar33 -
                                   (0xff < sStack_18c),
                                   CONCAT15((0 < sStack_18e) * (sStack_18e < 0x100) * bVar32 -
                                            (0xff < sStack_18e),
                                            CONCAT14((0 < (short)uVar28) * ((short)uVar28 < 0x100) *
                                                     (char)uVar28 - (0xff < (short)uVar28),
                                                     CONCAT13((0 < sStack_192) *
                                                              (sStack_192 < 0x100) * bVar31 -
                                                              (0xff < sStack_192),
                                                              CONCAT12((0 < sStack_194) *
                                                                       (sStack_194 < 0x100) * bVar30
                                                                       - (0xff < sStack_194),
                                                                       CONCAT11((0 < sStack_196) *
                                                                                (sStack_196 < 0x100)
                                                                                * bStackY_686 -
                                                                                (0xff < sStack_196),
                                                                                (0 < (short)uVar23)
                                                                                * ((short)uVar23 <
                                                                                  0x100) *
                                                                                (char)uVar23 -
                                                                                (0xff < (short)
                                                  uVar23))))))));
          }
          local_530 = local_530 + (long)in_ECX * 2;
          local_538 = local_538 + (long)in_R9D * 2;
          local_4c0 = local_4c0 + in_stack_00000010;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_highbd_ssse3(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const uint8_t *src0,
    int src0_stride, const uint8_t *src1, int src1_stride, int h, int w,
    int bd) {
  if (w < 8) {
    av1_build_compound_diffwtd_mask_highbd_c(mask, mask_type, src0, src0_stride,
                                             src1, src1_stride, h, w, bd);
  } else {
    assert(bd >= 8);
    assert((w % 8) == 0);
    assert(mask_type == DIFFWTD_38 || mask_type == DIFFWTD_38_INV);
    const __m128i x0 = _mm_setzero_si128();
    const __m128i xAOM_BLEND_A64_MAX_ALPHA =
        _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
    const int mask_base = 38;
    const __m128i xmask_base = _mm_set1_epi16(mask_base);
    const uint16_t *ssrc0 = CONVERT_TO_SHORTPTR(src0);
    const uint16_t *ssrc1 = CONVERT_TO_SHORTPTR(src1);
    if (bd == 8) {
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff = _mm_srai_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)),
                                          DIFF_FACTOR_LOG2);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_sub_epi16(xAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff = _mm_srai_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)),
                                          DIFF_FACTOR_LOG2);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    } else {
      const __m128i xshift = _mm_set1_epi64x(bd - 8 + DIFF_FACTOR_LOG2);
      if (mask_type == DIFFWTD_38_INV) {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff =
                _mm_sra_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)), xshift);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_sub_epi16(xAOM_BLEND_A64_MAX_ALPHA, m);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      } else {
        for (int i = 0; i < h; ++i) {
          for (int j = 0; j < w; j += 8) {
            __m128i s0 = _mm_loadu_si128((const __m128i *)&ssrc0[j]);
            __m128i s1 = _mm_loadu_si128((const __m128i *)&ssrc1[j]);
            __m128i diff =
                _mm_sra_epi16(_mm_abs_epi16(_mm_sub_epi16(s0, s1)), xshift);
            __m128i m = _mm_min_epi16(
                _mm_max_epi16(x0, _mm_add_epi16(diff, xmask_base)),
                xAOM_BLEND_A64_MAX_ALPHA);
            m = _mm_packus_epi16(m, m);
            _mm_storel_epi64((__m128i *)&mask[j], m);
          }
          ssrc0 += src0_stride;
          ssrc1 += src1_stride;
          mask += w;
        }
      }
    }
  }
}